

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_opt_step_adamw(ggml_context *ctx,ggml_tensor *a,ggml_tensor *grad,ggml_tensor *m,ggml_tensor *v
                   ,ggml_tensor *adamw_params)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  int line;
  
  if ((a->flags & 4) == 0) {
    pcVar3 = "a->flags & GGML_TENSOR_FLAG_PARAM";
    line = 0x1413;
  }
  else {
    _Var1 = ggml_are_same_shape(a,grad);
    if (_Var1) {
      _Var1 = ggml_are_same_shape(a,m);
      if (_Var1) {
        _Var1 = ggml_are_same_shape(a,v);
        if (_Var1) {
          if (adamw_params->type == GGML_TYPE_F32) {
            if (adamw_params->ne[1] * adamw_params->ne[0] * adamw_params->ne[2] *
                adamw_params->ne[3] == 7) {
              pgVar2 = ggml_view_tensor(ctx,a);
              pgVar2->op = GGML_OP_OPT_STEP_ADAMW;
              pgVar2->src[0] = a;
              pgVar2->src[1] = grad;
              pgVar2->src[2] = m;
              pgVar2->src[3] = v;
              pgVar2->src[4] = adamw_params;
              return pgVar2;
            }
            pcVar3 = "ggml_nelements(adamw_params) == 7";
            line = 0x1418;
          }
          else {
            pcVar3 = "adamw_params->type == GGML_TYPE_F32";
            line = 0x1417;
          }
        }
        else {
          pcVar3 = "ggml_are_same_shape(a, v)";
          line = 0x1416;
        }
      }
      else {
        pcVar3 = "ggml_are_same_shape(a, m)";
        line = 0x1415;
      }
    }
    else {
      pcVar3 = "ggml_are_same_shape(a, grad)";
      line = 0x1414;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

struct ggml_tensor * ggml_opt_step_adamw(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * grad,
        struct ggml_tensor  * m,
        struct ggml_tensor  * v,
        struct ggml_tensor  * adamw_params) {
    GGML_ASSERT(a->flags & GGML_TENSOR_FLAG_PARAM);
    GGML_ASSERT(ggml_are_same_shape(a, grad));
    GGML_ASSERT(ggml_are_same_shape(a, m));
    GGML_ASSERT(ggml_are_same_shape(a, v));
    GGML_ASSERT(adamw_params->type == GGML_TYPE_F32);
    GGML_ASSERT(ggml_nelements(adamw_params) == 7);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    result->op     = GGML_OP_OPT_STEP_ADAMW;
    result->src[0] = a;
    result->src[1] = grad;
    result->src[2] = m;
    result->src[3] = v;
    result->src[4] = adamw_params;

    return result;
}